

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

string * directories::MADPGetResultsDir_abi_cxx11_(void)

{
  string *in_RDI;
  wordexp_t p;
  string *dir;
  allocator<char> local_22;
  undefined1 local_21;
  allocator<char> *in_stack_ffffffffffffffe0;
  char **in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  wordexp("~/.madp/results",(wordexp_t *)&stack0xffffffffffffffe0,0);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator(&local_22);
  wordfree((wordexp_t *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

string directories::MADPGetResultsDir()
{
    wordexp_t p;
    wordexp("~/.madp/results",&p,0);
    string dir(p.we_wordv[0]);
    wordfree(&p);
    return(dir);
}